

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> * __thiscall
node::BlockManager::GetAllBlockIndices(BlockManager *this)

{
  long lVar1;
  bool bVar2;
  _Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> *in_RSI;
  unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  type *block_index;
  type *_;
  BlockMap *__range1;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *rv;
  iterator __end1;
  iterator __begin1;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  size_type in_stack_ffffffffffffffb0;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RSI,(char *)in_RDI,in_stack_ffffffffffffff7c,
             (AnnotatedMixin<std::recursive_mutex> *)0x37429c);
  std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::vector
            ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::
  unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
  ::size((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
          *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::reserve
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::
  unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
  ::begin(in_RDI);
  std::
  unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
  ::end(in_RDI);
  while (bVar2 = std::__detail::operator==
                           (in_RSI,(_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>
                                    *)in_RDI), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::operator*
              ((_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    std::get<0ul,uint256_const,CBlockIndex>
              ((pair<const_uint256,_CBlockIndex> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    std::get<1ul,uint256_const,CBlockIndex>
              ((pair<const_uint256,_CBlockIndex> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::push_back
              ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),(value_type *)0x374356)
    ;
    std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::operator++
              ((_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)in_RDI;
}

Assistant:

std::vector<CBlockIndex*> BlockManager::GetAllBlockIndices()
{
    AssertLockHeld(cs_main);
    std::vector<CBlockIndex*> rv;
    rv.reserve(m_block_index.size());
    for (auto& [_, block_index] : m_block_index) {
        rv.push_back(&block_index);
    }
    return rv;
}